

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCodeModel
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  ValueHolder local_40 [2];
  long local_30 [3];
  
  if (this->m_State == STATE_COMPUTED) {
    cmDumpCodeModel((Value *)local_40,
                    (this->super_cmServerProtocol).m_CMakeInstance._M_t.
                    super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                    super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                    super__Head_base<0UL,_cmake_*,_false>._M_head_impl);
    cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_40);
    Json::Value::~Value((Value *)local_40);
  }
  else {
    local_40[0].string_ = (char *)local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"No build system was generated yet.","");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0].string_,local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCodeModel(
  const cmServerRequest& request)
{
  if (this->m_State != STATE_COMPUTED) {
    return request.ReportError("No build system was generated yet.");
  }

  return request.Reply(cmDumpCodeModel(this->CMakeInstance()));
}